

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

bool __thiscall helics::CommonCore::checkForLocalPublication(CommonCore *this,ActionMessage *cmd)

{
  BasicHandleInfo *hand;
  string_view name;
  string_view string1;
  string_view string2;
  ActionMessage AStack_d8;
  
  name._M_str = (char *)(cmd->payload).heap;
  name._M_len = (cmd->payload).bufferSize;
  hand = HandleManager::getInterfaceHandle(&this->loopHandles,name,PUBLICATION);
  if (hand != (BasicHandleInfo *)0x0) {
    (cmd->dest_handle).hid = (hand->handle).handle.hid;
    (cmd->dest_id).gid = (hand->handle).fed_id.gid;
    setAsUsed(this,hand);
    routeMessage(this,cmd);
    ActionMessage::ActionMessage(&AStack_d8,cmd_add_publisher);
    AStack_d8.dest_id.gid = (cmd->source_id).gid;
    AStack_d8.dest_handle.hid = (cmd->source_handle).hid;
    AStack_d8.source_id.gid = (hand->handle).fed_id.gid;
    AStack_d8.source_handle.hid = (hand->handle).handle.hid;
    string1._M_str = (hand->type)._M_dataplus._M_p;
    string1._M_len = (hand->type)._M_string_length;
    string2._M_str = (hand->units)._M_dataplus._M_p;
    string2._M_len = (hand->units)._M_string_length;
    ActionMessage::setStringData(&AStack_d8,string1,string2);
    routeMessage(this,&AStack_d8);
    ActionMessage::~ActionMessage(&AStack_d8);
  }
  return hand != (BasicHandleInfo *)0x0;
}

Assistant:

bool CommonCore::checkForLocalPublication(ActionMessage& cmd)
{
    auto* pub = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::PUBLICATION);
    if (pub != nullptr) {
        // now send the same command to the publication
        cmd.dest_handle = pub->getInterfaceHandle();
        cmd.dest_id = pub->getFederateId();
        setAsUsed(pub);
        // send to
        routeMessage(cmd);
        // now send the notification to the subscription in the federateState
        ActionMessage notice(CMD_ADD_PUBLISHER);
        notice.dest_id = cmd.source_id;
        notice.dest_handle = cmd.source_handle;
        notice.source_id = pub->getFederateId();
        notice.source_handle = pub->getInterfaceHandle();
        notice.setStringData(pub->type, pub->units);
        routeMessage(notice);
        return true;
    }
    return false;
}